

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1M1Q<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_6,_1,_0,_6,_1> *l1,Matrix<float,_6,_1,_0,_6,_1> *l2
          )

{
  float fVar1;
  float fVar2;
  float fVar3;
  iterator __position;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *this;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar4;
  undefined8 *puVar5;
  long lVar6;
  assign_op<float,_float> *paVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  RealScalar z_2;
  float fVar11;
  float fVar12;
  float fVar13;
  RealScalar z;
  float fVar14;
  RealScalar z_1;
  float fVar15;
  float fVar16;
  Matrix<float,_3,_1,_0,_3,_1> ey;
  Matrix<float,_3,_1,_0,_3,_1> ex;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *trans;
  Matrix<float,_3,_3,_0,_3,_3> U2;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_4,_4,_0,_4,_4> TU_B;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  SrcEvaluatorType srcEvaluator_4;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_3,_3,_0,_3,_3> U1;
  DstEvaluatorType dstEvaluator_4;
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  assign_op<float,_float> local_5c1;
  Matrix<float,_3,_1,_0,_3,_1> local_5c0;
  Matrix<float,_3,_1,_0,_3,_1> local_5b4;
  undefined1 local_5a8 [8];
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  float fStack_560;
  float fStack_55c;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_558;
  float local_54c;
  float fStack_548;
  float local_544;
  float local_540;
  float local_53c;
  float local_538;
  float local_534;
  float local_530;
  float local_52c;
  undefined1 local_528 [4];
  float fStack_524;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500;
  undefined8 local_4fc;
  undefined8 uStack_4f4;
  float local_4ec;
  undefined1 local_4e8 [4];
  float fStack_4e4;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  float local_4c0;
  undefined8 local_4bc;
  undefined8 uStack_4b4;
  float local_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  undefined8 uStack_490;
  undefined1 local_488 [12];
  float fStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [28];
  float fStack_3fc;
  variable_if_dynamic<long,__1> local_3f8;
  variable_if_dynamic<long,__1> vStack_3f0;
  Index local_3e8;
  undefined4 local_3e0;
  undefined8 local_3dc;
  undefined8 uStack_3d4;
  undefined8 local_3cc;
  float local_3c4 [16];
  float fStack_384;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  plainobjectbase_evaluator_data<float,_3> local_260;
  undefined1 local_258 [28];
  float fStack_23c;
  float local_238 [29];
  undefined1 local_1c4 [8];
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  Matrix<float,_3,_1,_0,_3,_1> local_1a0;
  Matrix<float,_3,_1,_0,_3,_1> local_194;
  DstEvaluatorType local_188;
  float local_178;
  undefined8 uStack_174;
  Matrix<float,_3,_1,_0,_3,_1> MStack_16c;
  float fStack_160;
  float fStack_15c;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 local_148;
  float fStack_140;
  undefined8 uStack_13c;
  undefined4 uStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined4 local_104;
  float fStack_100;
  float fStack_fc;
  float fStack_f8;
  float local_f4;
  undefined4 uStack_f0;
  undefined4 local_ec;
  float local_e8;
  undefined8 uStack_e4;
  Matrix<float,_3,_1,_0,_3,_1> MStack_dc;
  float fStack_d0;
  float fStack_cc;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  float fStack_b0;
  undefined8 uStack_ac;
  undefined4 uStack_a4;
  float fStack_a0;
  float local_9c;
  undefined4 uStack_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 local_74;
  float fStack_70;
  float fStack_6c;
  undefined4 uStack_68;
  undefined4 local_64;
  undefined4 uStack_60;
  undefined4 local_5c;
  
  fVar10 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar8 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar9 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar11 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar12 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar13 = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  fVar15 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar16 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar1 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar14 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar2 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  fVar3 = (l2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       fVar8 * fVar13 - fVar12 * fVar9;
  local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       fVar9 * fVar11 - fVar13 * fVar10;
  local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar10 * fVar12 - fVar11 * fVar8;
  fVar11 = fVar16 * fVar3 - fVar2 * fVar1;
  fVar12 = fVar1 * fVar14 - fVar3 * fVar15;
  fVar14 = fVar15 * fVar2 - fVar14 * fVar16;
  fVar13 = fVar9 * local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] +
           fVar8 * local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] +
           fVar10 * local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0];
  local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] - fVar10 * fVar13;
  local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] - fVar8 * fVar13;
  local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] - fVar13 * fVar9;
  fVar10 = fVar1 * fVar14 + fVar16 * fVar12 + fVar15 * fVar11;
  local_438 = ZEXT416((uint)(fVar11 - fVar15 * fVar10));
  local_448 = ZEXT416((uint)(fVar12 - fVar16 * fVar10));
  local_428 = ZEXT416((uint)(fVar14 - fVar10 * fVar1));
  local_e8 = 1.0;
  uStack_e4 = 0;
  MStack_dc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  MStack_dc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  MStack_dc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  fStack_d0 = 0.0;
  fStack_cc = 1.0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  fStack_b0 = 1.0;
  uStack_ac = 0;
  uStack_a4 = 0;
  fStack_a0 = 0.0;
  local_9c = 0.0;
  uStack_98 = 0;
  local_94 = 0x3f800000;
  local_90 = 0;
  uStack_88 = 0;
  local_80 = 0;
  local_78 = 0x3f800000;
  local_74 = 0;
  fStack_70 = 0.0;
  fStack_6c = 0.0;
  uStack_68 = 0;
  local_64 = 0;
  uStack_60 = 0;
  local_5c = 0x3f800000;
  local_178 = 1.0;
  uStack_174 = 0;
  MStack_16c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  MStack_16c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  MStack_16c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  fStack_160 = 0.0;
  fStack_15c = 1.0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  fStack_140 = 1.0;
  uStack_13c = 0;
  uStack_134 = 0;
  fStack_130 = 0.0;
  fStack_12c = 0.0;
  fStack_128 = 0.0;
  fStack_124 = 1.0;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  local_108 = 0x3f800000;
  local_104 = 0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  fStack_f8 = 0.0;
  local_f4 = 0.0;
  uStack_f0 = 0;
  local_ec = 0x3f800000;
  local_288 = ZEXT416((uint)local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[0]);
  local_298 = ZEXT416((uint)local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[1]);
  local_278 = ZEXT416((uint)local_194.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[2]);
  local_568 = l2;
  local_558 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_418,&local_194);
  local_258._8_4_ = 4.2039e-45;
  local_258._12_4_ = 0.0;
  local_258._16_4_ = 4.2039e-45;
  local_258._20_4_ = 0.0;
  unique0x00005300 = &local_e8;
  local_238[0] = 4.2039e-45;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  local_238[3] = 0.0;
  local_238[4] = 8.40779e-45;
  local_238[5] = 0.0;
  uStack_4e0 = (SrcEvaluatorType *)local_528;
  uStack_4d8 = (assign_op<float,_float> *)local_488;
  local_5a8 = (undefined1  [8])&MStack_dc;
  uStack_4d0 = (DstXprType *)local_258;
  local_258._0_8_ = &MStack_dc;
  uStack_520 = (float *)local_418;
  _local_4e8 = (DstEvaluatorType *)local_5a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_4e8);
  local_1a0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)local_438._0_4_;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)local_448._0_4_;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (float)local_428._0_4_;
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_418,&local_1a0);
  local_258._8_4_ = 4.2039e-45;
  local_258._12_4_ = 0.0;
  local_258._16_4_ = 4.2039e-45;
  local_258._20_4_ = 0.0;
  unique0x00005300 = &local_178;
  local_238[0] = 4.2039e-45;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  local_238[3] = 0.0;
  local_238[4] = 8.40779e-45;
  local_238[5] = 0.0;
  uStack_520 = (float *)local_418;
  uStack_4e0 = (SrcEvaluatorType *)local_528;
  uStack_4d8 = (assign_op<float,_float> *)local_488;
  local_5a8 = (undefined1  [8])&MStack_16c;
  uStack_4d0 = (DstXprType *)local_258;
  local_258._0_8_ = &MStack_16c;
  _local_4e8 = (DstEvaluatorType *)local_5a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_4e8);
  fStack_49c = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[0];
  local_308 = ZEXT416((uint)(l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                            m_storage.m_data.array[1]);
  fStack_2cc = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[2];
  local_2c8 = ZEXT416((uint)(l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                            m_storage.m_data.array[3]);
  local_4a8 = fStack_49c * local_e8;
  fStack_4a4 = fStack_49c * (float)uStack_e4;
  fStack_4a0 = fStack_49c * uStack_e4._4_4_;
  fStack_49c = fStack_49c *
               MStack_dc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
  local_358 = fStack_d0;
  fStack_354 = fStack_cc;
  uStack_350 = uStack_c8;
  local_2b8 = fStack_a0;
  fStack_2b4 = local_9c;
  uStack_2b0 = CONCAT44(local_94,uStack_98);
  local_2d8 = fStack_2cc * (float)local_b8;
  fStack_2d4 = fStack_2cc * local_b8._4_4_;
  fStack_2d0 = fStack_2cc * fStack_b0;
  fStack_2cc = fStack_2cc * (float)uStack_ac;
  fStack_31c = (l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[4];
  local_328 = fStack_31c * (float)uStack_88;
  fStack_324 = fStack_31c * uStack_88._4_4_;
  fStack_320 = fStack_31c * (float)local_80;
  fStack_31c = fStack_31c * local_80._4_4_;
  local_498 = fStack_70;
  fStack_494 = fStack_6c;
  uStack_490 = CONCAT44(local_64,uStack_68);
  local_348 = ZEXT416((uint)(l1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                            m_storage.m_data.array[5]);
  fStack_29c = (local_568->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[0];
  local_318 = ZEXT416((uint)(local_568->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                            .m_storage.m_data.array[1]);
  fStack_2dc = (local_568->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[2];
  local_2a8 = fStack_29c * local_178;
  fStack_2a4 = fStack_29c * (float)uStack_174;
  fStack_2a0 = fStack_29c * uStack_174._4_4_;
  fStack_29c = fStack_29c *
               MStack_16c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
  local_2f8 = ZEXT416((uint)(local_568->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                            .m_storage.m_data.array[3]);
  local_2e8 = fStack_2dc * (float)local_148;
  fStack_2e4 = fStack_2dc * local_148._4_4_;
  fStack_2e0 = fStack_2dc * fStack_140;
  fStack_2dc = fStack_2dc * (float)uStack_13c;
  fStack_32c = (local_568->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
               m_data.array[4];
  local_338 = fStack_32c * (float)uStack_118;
  fStack_334 = fStack_32c * uStack_118._4_4_;
  fStack_330 = fStack_32c * (float)local_110;
  fStack_32c = fStack_32c * local_110._4_4_;
  local_3c4[0xf] = fStack_160;
  fStack_384 = fStack_15c;
  uStack_380 = uStack_158;
  local_368 = ZEXT416((uint)(local_568->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                            .m_storage.m_data.array[5]);
  local_258._0_8_ = &local_5b4;
  local_258._8_4_ = 0.0;
  local_258._12_4_ = 0.0;
  local_258._16_4_ = 1.4013e-45;
  local_258._20_4_ = 0.0;
  local_258._24_4_ = 1.4013e-45;
  fStack_23c = 0.0;
  local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_418._0_4_ = 0.0;
  local_378 = fStack_130;
  fStack_374 = fStack_12c;
  fStack_370 = fStack_128;
  fStack_36c = fStack_124;
  local_568._0_4_ = fStack_100;
  local_568._4_4_ = fStack_fc;
  fStack_560 = fStack_f8;
  fStack_55c = local_f4;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_258,
                      (Scalar *)local_418);
  local_4e8 = (undefined1  [4])0x0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
            (pCVar4,(Scalar *)local_4e8);
  if ((CONCAT44(fStack_23c,local_258._24_4_) + CONCAT44(local_258._12_4_,local_258._8_4_) == 3) &&
     (CONCAT44(local_258._20_4_,local_258._16_4_) == 1)) {
    local_258._0_8_ = &local_5c0;
    local_258._8_4_ = 0.0;
    local_258._12_4_ = 0.0;
    local_258._16_4_ = 1.4013e-45;
    local_258._20_4_ = 0.0;
    local_258._24_4_ = 1.4013e-45;
    fStack_23c = 0.0;
    local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_418._0_4_ = 1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_258,
                        (Scalar *)local_418);
    local_4e8 = (undefined1  [4])0x0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
              (pCVar4,(Scalar *)local_4e8);
    if ((CONCAT44(fStack_23c,local_258._24_4_) + CONCAT44(local_258._12_4_,local_258._8_4_) == 3) &&
       (CONCAT44(local_258._20_4_,local_258._16_4_) == 1)) {
      local_1bc = local_498 * (float)local_348._0_4_ +
                  local_2b8 * (float)local_2c8._0_4_ +
                  local_4a8 + local_358 * (float)local_308._0_4_ + local_2d8 + local_328;
      local_1b0 = fStack_494 * (float)local_348._0_4_ +
                  fStack_2b4 * (float)local_2c8._0_4_ +
                  fStack_4a4 + fStack_354 * (float)local_308._0_4_ + fStack_2d4 + fStack_324;
      local_1a4 = (float)uStack_490 * (float)local_348._0_4_ +
                  (float)uStack_2b0 * (float)local_2c8._0_4_ +
                  fStack_4a0 + (float)uStack_350 * (float)local_308._0_4_ + fStack_2d0 + fStack_320;
      fVar8 = local_568._4_4_ * (float)local_368._0_4_ +
              fStack_374 * (float)local_2f8._0_4_ +
              fStack_2a4 + fStack_384 * (float)local_318._0_4_ + fStack_2e4 + fStack_334;
      local_4a8 = fStack_560 * (float)local_368._0_4_ +
                  fStack_370 * (float)local_2f8._0_4_ +
                  fStack_2a0 + (float)uStack_380 * (float)local_318._0_4_ + fStack_2e0 + fStack_330;
      fStack_4a4 = fStack_55c * (float)local_368._0_4_ +
                   fStack_36c * (float)local_2f8._0_4_ +
                   fStack_29c + uStack_380._4_4_ * (float)local_318._0_4_ + fStack_2dc + fStack_32c;
      local_568 = (Matrix<float,_6,_1,_0,_6,_1> *)
                  CONCAT44(fVar8,(float)local_568 * (float)local_368._0_4_ +
                                 local_378 * (float)local_2f8._0_4_ +
                                 local_2a8 + local_3c4[0xf] * (float)local_318._0_4_ + local_2e8 +
                                 local_338);
      _fStack_560 = CONCAT44(fStack_4a4,local_4a8);
      local_1c4._0_4_ =
           local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_1a4 -
           local_1b0 *
           local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      local_1b8 = local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] * local_1bc -
                  local_1a4 *
                  local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      local_1ac = local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] * local_1b0 -
                  local_1bc *
                  local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
      fVar10 = local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] * local_1a4 -
               local_1b0 *
               local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
      fVar9 = local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] * local_1bc -
              local_1a4 *
              local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0];
      fVar11 = local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_1b0 -
               local_1bc *
               local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      fVar13 = local_1ac * local_1ac + local_1b8 * local_1b8 +
               (float)local_1c4._0_4_ * (float)local_1c4._0_4_;
      fVar12 = SQRT(fVar13);
      fVar15 = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
      fVar16 = SQRT(fVar15);
      if (fVar12 <= fVar16) {
        local_1c4._0_4_ = fVar10;
        local_1b8 = fVar9;
        local_1ac = fVar11;
        if (0.0 < fVar15) {
          local_1c4._0_4_ = fVar10 / fVar16;
          local_1b8 = fVar9 / fVar16;
          local_1ac = fVar11 / fVar16;
        }
      }
      else if (0.0 < fVar13) {
        local_1c4._0_4_ = (float)local_1c4._0_4_ / fVar12;
        local_1b8 = local_1b8 / fVar12;
        local_1ac = local_1ac / fVar12;
      }
      fStack_4a0 = local_4a8;
      fStack_49c = fStack_4a4;
      _local_498 = CONCAT44(fVar8,fVar8);
      uStack_490 = CONCAT44(fVar8,fVar8);
      puVar5 = (undefined8 *)local_1c4;
      local_1c4._4_4_ = local_1b0 * local_1ac - local_1b8 * local_1a4;
      local_1b4 = local_1a4 * (float)local_1c4._0_4_ - local_1ac * local_1bc;
      local_1a8 = local_1b8 * local_1bc - (float)local_1c4._0_4_ * local_1b0;
      local_4e8 = (undefined1  [4])0x3f800000;
      fStack_4e4 = 0.0;
      uStack_4e0._0_4_ = 0.0;
      uStack_4e0._4_4_ = 0.0;
      uStack_4d8._0_4_ = 0.0;
      uStack_4d8._4_4_ = 1.0;
      uStack_4d0 = (DstXprType *)0x0;
      uStack_4c8 = 0;
      local_4c0 = 1.0;
      local_4bc = 0;
      uStack_4b4 = 0;
      local_4ac = 1.0;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&uStack_4e0 + lVar6) = *(undefined4 *)(puVar5 + 1);
        *(undefined8 *)(local_4e8 + lVar6) = *puVar5;
        puVar5 = (undefined8 *)((long)puVar5 + 0xc);
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      local_258._0_4_ = 1.0;
      local_258._4_4_ = 0.0;
      local_258._8_4_ = 0.0;
      local_258._12_4_ = 0.0;
      local_258._16_4_ = 0.0;
      local_258._20_4_ = 0.0;
      local_258._24_4_ = 0.0;
      fStack_23c = 1.0;
      local_238[0] = 0.0;
      local_238[1] = 0.0;
      local_238[2] = 0.0;
      local_238[3] = 0.0;
      local_238[4] = 0.0;
      local_238[5] = 0.0;
      local_238[6] = 1.0;
      local_238[7] = 0.0;
      local_238[8] = 0.0;
      local_238[9] = 0.0;
      local_238[10] = 0.0;
      local_238[0xb] = 0.0;
      local_238[0xc] = 0.0;
      local_238[0xd] = 1.0;
      local_238[0xe] = 0.0;
      local_238[0xf] = 0.0;
      local_238[0x10] = 0.0;
      local_238[0x11] = 0.0;
      local_238[0x12] = 0.0;
      local_238[0x13] = 0.0;
      local_238[0x14] = 1.0;
      local_238[0x15] = 0.0;
      local_238[0x16] = 0.0;
      local_238[0x17] = 0.0;
      local_238[0x18] = 0.0;
      local_238[0x19] = 0.0;
      local_238[0x1a] = 0.0;
      local_238[0x1b] = 1.0;
      local_418._8_4_ = 4.2039e-45;
      local_418._12_4_ = 0.0;
      local_418._16_4_ = 4.2039e-45;
      local_418._20_4_ = 0.0;
      local_3f8.m_value = 0;
      vStack_3f0.m_value = 0;
      local_3e8 = 6;
      local_488._0_8_ = local_1c4;
      uStack_520 = (float *)local_488;
      paVar7 = (assign_op<float,_float> *)&local_54c;
      local_5a8 = (undefined1  [8])local_258;
      uStack_510 = (DstXprType *)local_418;
      local_418._0_8_ = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_258;
      _local_528 = (DstEvaluatorType *)local_5a8;
      uStack_518 = paVar7;
      unique0x10002aed = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_258;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_528);
      local_418._8_4_ = 4.2039e-45;
      local_418._12_4_ = 0.0;
      local_418._16_4_ = 4.2039e-45;
      local_418._20_4_ = 0.0;
      unique0x00005300 = (CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_258;
      local_3f8.m_value = 3;
      vStack_3f0.m_value = 3;
      local_3e8 = 6;
      local_488._0_8_ = local_1c4;
      uStack_520 = (float *)local_488;
      local_5a8 = (undefined1  [8])(local_238 + 0xd);
      uStack_510 = (DstXprType *)local_418;
      local_418._0_8_ = local_238 + 0xd;
      _local_528 = (DstEvaluatorType *)local_5a8;
      uStack_518 = paVar7;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_528);
      local_54c = local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] * local_4a8 -
                  local_498 *
                  local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
      local_540 = local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] * (float)local_568 -
                  local_4a8 *
                  local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      local_534 = local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] * local_498 -
                  (float)local_568 *
                  local_5c0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
      fVar10 = local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] * local_4a8 -
               local_498 *
               local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
      fVar8 = local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] * (float)local_568 -
              local_4a8 *
              local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0];
      fVar9 = local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] * local_498 -
              (float)local_568 *
              local_5b4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1];
      fVar12 = local_534 * local_534 + local_540 * local_540 + local_54c * local_54c;
      fVar11 = SQRT(fVar12);
      fVar15 = fVar9 * fVar9 + fVar8 * fVar8 + fVar10 * fVar10;
      fVar13 = SQRT(fVar15);
      if (fVar11 <= fVar13) {
        local_54c = fVar10;
        local_540 = fVar8;
        local_534 = fVar9;
        if (0.0 < fVar15) {
          local_54c = fVar10 / fVar13;
          local_540 = fVar8 / fVar13;
          local_534 = fVar9 / fVar13;
        }
      }
      else if (0.0 < fVar12) {
        local_54c = local_54c / fVar11;
        local_540 = local_540 / fVar11;
        local_534 = local_534 / fVar11;
      }
      fStack_548 = local_498 * local_534 - local_540 * local_4a8;
      local_53c = local_4a8 * local_54c - local_534 * (float)local_568;
      local_530 = local_540 * (float)local_568 - local_54c * local_498;
      local_544 = (float)local_568;
      local_538 = local_498;
      local_52c = local_4a8;
      local_528 = (undefined1  [4])0x3f800000;
      fStack_524 = 0.0;
      uStack_520._0_4_ = 0.0;
      uStack_520._4_4_ = 0.0;
      uStack_518._0_4_ = 0.0;
      uStack_518._4_4_ = 1.0;
      uStack_510 = (DstXprType *)0x0;
      uStack_508 = 0;
      local_500 = 1.0;
      local_4fc = 0;
      uStack_4f4 = 0;
      local_4ec = 1.0;
      lVar6 = 0;
      do {
        *(float *)((long)&uStack_520 + lVar6) = *(float *)(paVar7 + 8);
        *(undefined8 *)(local_528 + lVar6) = *(undefined8 *)paVar7;
        paVar7 = paVar7 + 0xc;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      local_418._0_4_ = 1.0;
      local_418._4_4_ = 0.0;
      local_418._8_4_ = 0.0;
      local_418._12_4_ = 0.0;
      local_418._16_4_ = 0.0;
      local_418._20_4_ = 0.0;
      local_418._24_4_ = 0.0;
      fStack_3fc = 1.0;
      local_3f8.m_value = 0;
      vStack_3f0.m_value = 0;
      local_3e8 = 0;
      local_3e0 = 0x3f800000;
      local_3dc = 0;
      uStack_3d4 = 0;
      local_3cc = 0;
      local_3c4[0] = 1.0;
      local_3c4[1] = 0.0;
      local_3c4[2] = 0.0;
      local_3c4[3] = 0.0;
      local_3c4[4] = 0.0;
      local_3c4[5] = 0.0;
      local_3c4[6] = 0.0;
      local_3c4[7] = 1.0;
      local_3c4[8] = 0.0;
      local_3c4[9] = 0.0;
      local_3c4[10] = 0.0;
      local_3c4[0xb] = 0.0;
      local_3c4[0xc] = 0.0;
      local_3c4[0xd] = 0.0;
      local_3c4[0xe] = 1.0;
      uStack_5a0 = 3;
      local_598 = 3;
      local_588 = 0;
      uStack_580 = 0;
      local_578 = 6;
      local_260.data = &local_54c;
      local_478 = &local_5c1;
      uStack_470 = (DstXprType *)local_5a8;
      local_5a8 = (undefined1  [8])local_418;
      uStack_590 = (XprTypeNested)local_418;
      local_488._0_8_ = &local_188;
      unique0x10002a85 = &local_260;
      local_188.super_block_evaluator<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_6,_6>_>
      .m_data = (PointerType)local_418;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_488);
      uStack_5a0 = 3;
      local_598 = 3;
      local_588 = 3;
      uStack_580 = 3;
      local_578 = 6;
      local_260.data = &local_54c;
      local_478 = &local_5c1;
      uStack_470 = (DstXprType *)local_5a8;
      local_5a8 = (undefined1  [8])local_3c4;
      uStack_590 = (XprTypeNested)local_418;
      local_488._0_8_ = &local_188;
      unique0x10002a8d = &local_260;
      local_188.super_block_evaluator<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_6,_6>_>
      .m_data = local_3c4;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_488);
      this = local_558;
      fStack_570 = (float)local_278._0_4_ * local_4c0 +
                   (float)local_298._0_4_ * (float)uStack_4d0 +
                   (float)local_288._0_4_ * (float)uStack_4e0 + uStack_4b4._4_4_;
      fStack_56c = (float)local_278._0_4_ * (float)local_4bc +
                   (float)local_298._0_4_ * uStack_4d0._4_4_ +
                   (float)local_288._0_4_ * uStack_4e0._4_4_ + local_4ac;
      fVar10 = local_4bc._4_4_ * 0.0;
      fVar8 = (float)uStack_4b4 * 0.0;
      fVar9 = uStack_4b4._4_4_ * 0.0;
      fVar11 = local_4ac * 0.0;
      local_5a8._4_4_ = fStack_4e4 + uStack_4d8._4_4_ * 0.0 + uStack_4c8._4_4_ * 0.0 + fVar8;
      local_5a8._0_4_ =
           (float)local_4e8 + (float)uStack_4d8 * 0.0 + (float)uStack_4c8 * 0.0 + fVar10;
      uStack_5a0._4_4_ = uStack_4e0._4_4_ + uStack_4d0._4_4_ * 0.0 + (float)local_4bc * 0.0 + fVar11
      ;
      uStack_5a0._0_4_ = (float)uStack_4e0 + (float)uStack_4d0 * 0.0 + local_4c0 * 0.0 + fVar9;
      local_598._4_4_ = fStack_4e4 * 0.0 + uStack_4d8._4_4_ + uStack_4c8._4_4_ * 0.0 + fVar8;
      local_598._0_4_ =
           (float)local_4e8 * 0.0 + (float)uStack_4d8 + (float)uStack_4c8 * 0.0 + fVar10;
      uStack_590 = (XprTypeNested)
                   CONCAT44(uStack_4e0._4_4_ * 0.0 + uStack_4d0._4_4_ + (float)local_4bc * 0.0 +
                            fVar11,(float)uStack_4e0 * 0.0 + (float)uStack_4d0 + local_4c0 * 0.0 +
                                   fVar9);
      local_588._4_4_ = fStack_4e4 * 0.0 + uStack_4d8._4_4_ * 0.0 + uStack_4c8._4_4_ + fVar8;
      local_588._0_4_ =
           (float)local_4e8 * 0.0 + (float)uStack_4d8 * 0.0 + (float)uStack_4c8 + fVar10;
      uStack_580._4_4_ = uStack_4e0._4_4_ * 0.0 + uStack_4d0._4_4_ * 0.0 + (float)local_4bc + fVar11
      ;
      uStack_580._0_4_ = (float)uStack_4e0 * 0.0 + (float)uStack_4d0 * 0.0 + local_4c0 + fVar9;
      local_578 = CONCAT44((float)local_278._0_4_ * uStack_4c8._4_4_ +
                           (float)local_298._0_4_ * uStack_4d8._4_4_ +
                           (float)local_288._0_4_ * fStack_4e4 + (float)uStack_4b4,
                           (float)local_278._0_4_ * (float)uStack_4c8 +
                           (float)local_298._0_4_ * (float)uStack_4d8 +
                           (float)local_288._0_4_ * (float)local_4e8 + local_4bc._4_4_);
      local_458 = (float)local_428._0_4_ * (float)uStack_508 +
                  (float)local_448._0_4_ * (float)uStack_518 +
                  (float)local_438._0_4_ * (float)local_528 + local_4fc._4_4_;
      fStack_454 = (float)local_428._0_4_ * uStack_508._4_4_ +
                   (float)local_448._0_4_ * uStack_518._4_4_ + (float)local_438._0_4_ * fStack_524 +
                   (float)uStack_4f4;
      fStack_450 = (float)local_428._0_4_ * local_500 +
                   (float)local_448._0_4_ * (float)uStack_510 +
                   (float)local_438._0_4_ * (float)uStack_520 + uStack_4f4._4_4_;
      fStack_44c = (float)local_428._0_4_ * (float)local_4fc +
                   (float)local_448._0_4_ * uStack_510._4_4_ +
                   (float)local_438._0_4_ * uStack_520._4_4_ + local_4ec;
      local_468 = local_4fc._4_4_ * 0.0;
      fStack_464 = (float)uStack_4f4 * 0.0;
      fStack_460 = uStack_4f4._4_4_ * 0.0;
      fStack_45c = local_4ec * 0.0;
      local_488._4_4_ = fStack_524 + uStack_518._4_4_ * 0.0 + uStack_508._4_4_ * 0.0 + fStack_464;
      local_488._0_4_ =
           (float)local_528 + (float)uStack_518 * 0.0 + (float)uStack_508 * 0.0 + local_468;
      stack0xfffffffffffffb80 =
           (plainobjectbase_evaluator_data<float,_3> *)
           CONCAT44(uStack_520._4_4_ + uStack_510._4_4_ * 0.0 + (float)local_4fc * 0.0 + fStack_45c,
                    (float)uStack_520 + (float)uStack_510 * 0.0 + local_500 * 0.0 + fStack_460);
      local_478 = (assign_op<float,_float> *)
                  CONCAT44(fStack_524 * 0.0 + uStack_518._4_4_ + uStack_508._4_4_ * 0.0 + fStack_464
                           ,(float)local_528 * 0.0 + (float)uStack_518 + (float)uStack_508 * 0.0 +
                            local_468);
      uStack_470 = (DstXprType *)
                   CONCAT44(uStack_520._4_4_ * 0.0 + uStack_510._4_4_ + (float)local_4fc * 0.0 +
                            fStack_45c,
                            (float)uStack_520 * 0.0 + (float)uStack_510 + local_500 * 0.0 +
                            fStack_460);
      local_468 = (float)local_528 * 0.0 + (float)uStack_518 * 0.0 + (float)uStack_508 + local_468;
      fStack_464 = fStack_524 * 0.0 + uStack_518._4_4_ * 0.0 + uStack_508._4_4_ + fStack_464;
      fStack_460 = (float)uStack_520 * 0.0 + (float)uStack_510 * 0.0 + local_500 + fStack_460;
      fStack_45c = uStack_520._4_4_ * 0.0 + uStack_510._4_4_ * 0.0 + (float)local_4fc + fStack_45c;
      *(undefined8 *)local_558 = 0;
      *(undefined8 *)(local_558 + 8) = 0;
      *(undefined8 *)(local_558 + 0x10) = 0;
      puVar5 = *(undefined8 **)(local_558 + 8);
      if (puVar5 == (undefined8 *)0x0) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  (local_558,(iterator)0x0,(Matrix<float,_4,_4,_0,_4,_4> *)local_5a8);
      }
      else {
        puVar5[6] = local_578;
        puVar5[7] = CONCAT44(fStack_56c,fStack_570);
        puVar5[4] = local_588;
        puVar5[5] = uStack_580;
        puVar5[2] = local_598;
        puVar5[3] = uStack_590;
        *puVar5 = local_5a8;
        puVar5[1] = uStack_5a0;
        *(undefined8 **)(local_558 + 8) = puVar5 + 8;
      }
      __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8);
      if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 0x10)) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  (this,__position,(Matrix<float,_4,_4,_0,_4,_4> *)local_488);
      }
      else {
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 0xc) = CONCAT44(fStack_454,local_458);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 0xe) = CONCAT44(fStack_44c,fStack_450);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 8) = CONCAT44(fStack_464,local_468);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 10) = CONCAT44(fStack_45c,fStack_460);
        *(assign_op<float,_float> **)
         (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 4) = local_478;
        *(DstXprType **)
         (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 6) = uStack_470;
        *(undefined8 *)
         ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
         m_storage.m_data.array = local_488._0_8_;
        *(plainobjectbase_evaluator_data<float,_3> **)
         (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 2) = stack0xfffffffffffffb80;
        *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8) = __position._M_current + 1;
      }
      return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)this;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}